

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall despot::BaseTag::Init(BaseTag *this,istream *is)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  *this_02;
  _Rb_tree_color _Var1;
  pointer pvVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  State *this_03;
  _Base_ptr p_Var9;
  _Self __tmp;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  State next;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_80;
  State local_50 [12];
  int local_44;
  _Base_ptr local_38;
  
  ReadConfig(this,is);
  iVar6 = (**(code **)(*(long *)this + 0x10))(this);
  std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::resize
            (&this->states_,(long)iVar6);
  this_00 = &this->rob_;
  iVar6 = (**(code **)(*(long *)this + 0x10))(this);
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)iVar6);
  this_01 = &this->opp_;
  iVar6 = (**(code **)(*(long *)this + 0x10))(this);
  std::vector<int,_std::allocator<int>_>::resize(this_01,(long)iVar6);
  iVar6 = despot::Floor::NumCells();
  if (0 < iVar6) {
    iVar6 = 0;
    do {
      iVar7 = despot::Floor::NumCells();
      if (0 < iVar7) {
        iVar7 = 0;
        do {
          iVar8 = despot::Floor::NumCells();
          this_03 = (State *)operator_new(0x20);
          despot::State::State(this_03);
          iVar8 = iVar8 * iVar6 + iVar7;
          *(undefined ***)this_03 = &PTR__State_0011f3c0;
          *(int *)(this_03 + 0xc) = iVar8;
          (this->states_).
          super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
          super__Vector_impl_data._M_start[iVar8] = (TagState *)this_03;
          (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[iVar8] = iVar6;
          (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[iVar8] = iVar7;
          iVar7 = iVar7 + 1;
          iVar8 = despot::Floor::NumCells();
        } while (iVar7 < iVar8);
      }
      iVar6 = iVar6 + 1;
      iVar7 = despot::Floor::NumCells();
    } while (iVar6 < iVar7);
  }
  this_02 = &this->transition_probabilities_;
  iVar6 = (**(code **)(*(long *)this + 0x10))(this);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(this_02,(long)iVar6);
  iVar6 = (**(code **)(*(long *)this + 0x10))(this);
  if (0 < iVar6) {
    lVar12 = 0;
    do {
      pvVar2 = (this->transition_probabilities_).
               super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar6 = (**(code **)(*(long *)this + 0x18))(this);
      std::
      vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
      ::resize(pvVar2 + lVar12,(long)iVar6);
      OppTransitionDistribution
                ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *
                 )&local_80,this,(int)lVar12);
      for (lVar11 = 0; iVar6 = (**(code **)(*(long *)this + 0x18))(), lVar11 < iVar6;
          lVar11 = lVar11 + 1) {
        lVar3 = *(long *)&(this_02->
                          super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[lVar12].
                          super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        puVar4 = *(undefined8 **)(lVar3 + lVar11 * 0x18);
        puVar5 = *(undefined8 **)(lVar3 + 8 + lVar11 * 0x18);
        if (puVar5 != puVar4) {
          puVar10 = puVar4;
          do {
            (**(code **)*puVar10)(puVar10);
            puVar10 = puVar10 + 4;
          } while (puVar10 != puVar5);
          *(undefined8 **)(lVar3 + lVar11 * 0x18 + 8) = puVar4;
        }
        iVar6 = NextRobPosition(this,(this->rob_).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[lVar12],
                                (ACT_TYPE)lVar11);
        if (lVar11 == 4) {
          if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left !=
              &local_80._M_impl.super__Rb_tree_header &&
              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar12] !=
              (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar12]) {
LAB_0010f526:
            p_Var9 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
            do {
              despot::State::State(local_50);
              _Var1 = p_Var9[1]._M_color;
              iVar7 = despot::Floor::NumCells();
              local_44 = iVar7 * iVar6 + _Var1;
              local_38 = p_Var9[1]._M_parent;
              std::vector<despot::State,_std::allocator<despot::State>_>::push_back
                        ((vector<despot::State,_std::allocator<despot::State>_> *)
                         (*(long *)&(this_02->
                                    super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[lVar12].
                                    super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                    ._M_impl.super__Vector_impl_data + lVar11 * 0x18),local_50);
              despot::State::~State(local_50);
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
            } while ((_Rb_tree_header *)p_Var9 != &local_80._M_impl.super__Rb_tree_header);
          }
        }
        else if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left !=
                 &local_80._M_impl.super__Rb_tree_header) goto LAB_0010f526;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&local_80);
      lVar12 = lVar12 + 1;
      iVar6 = (**(code **)(*(long *)this + 0x10))(this);
    } while (lVar12 < iVar6);
  }
  return;
}

Assistant:

void BaseTag::Init(istream& is) {
	ReadConfig(is);

	TagState* state;
	states_.resize(NumStates());
	rob_.resize(NumStates());
	opp_.resize(NumStates());
	for (int rob = 0; rob < floor_.NumCells(); rob++) {
		for (int opp = 0; opp < floor_.NumCells(); opp++) {
			int s = RobOppIndicesToStateIndex(rob, opp);
			state = new TagState(s);
			states_[s] = state;
			rob_[s] = rob;
			opp_[s] = opp;
		}
	}

	// Build transition matrix
	transition_probabilities_.resize(NumStates());
	for (int s = 0; s < NumStates(); s++) {
		transition_probabilities_[s].resize(NumActions());

		const map<int, double>& opp_distribution = OppTransitionDistribution(s);
		for (int a = 0; a < NumActions(); a++) {
			transition_probabilities_[s][a].clear();

			int next_rob = NextRobPosition(rob_[s], a);

			if (!(a == TagAction() && rob_[s] == opp_[s])) { // No transition upon termination
				for (map<int, double>::const_iterator it = opp_distribution.begin();
					it != opp_distribution.end(); it++) {
					State next;
					next.state_id = RobOppIndicesToStateIndex(next_rob,
						it->first);
					next.weight = it->second;

					transition_probabilities_[s][a].push_back(next);
				}
			}
		}
	}
}